

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

double sptk::world::matlab_std(double *x,int x_length)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  int i_1;
  double s;
  int i;
  double average;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    local_18 = *(double *)(in_RDI + (long)local_1c * 8) + local_18;
  }
  local_28 = 0.0;
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    dVar1 = pow(*(double *)(in_RDI + (long)local_2c * 8) - local_18 / (double)in_ESI,2.0);
    local_28 = dVar1 + local_28;
  }
  dVar1 = sqrt(local_28 / (double)(in_ESI + -1));
  return dVar1;
}

Assistant:

double matlab_std(const double *x, int x_length) {
  double average = 0.0;
  for (int i = 0; i < x_length; ++i) average += x[i];
  average /= x_length;

  double s = 0.0;
  for (int i = 0; i < x_length; ++i) s += pow(x[i] - average, 2.0);
  s /= (x_length - 1);

  return sqrt(s);
}